

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash,uchar *key,size_t keylen)

{
  long lVar1;
  uchar rkey [64];
  uint local_c8 [16];
  secp256k1_sha256 local_88;
  
  if (keylen < 0x41) {
    memcpy(local_c8,key,keylen);
    memset((void *)((long)local_c8 + keylen),0,0x40 - keylen);
  }
  else {
    local_88.s[0] = 0x6a09e667;
    local_88.s[1] = 0xbb67ae85;
    local_88.s[2] = 0x3c6ef372;
    local_88.s[3] = 0xa54ff53a;
    local_88.s[4] = 0x510e527f;
    local_88.s[5] = 0x9b05688c;
    local_88.s[6] = 0x1f83d9ab;
    local_88.s[7] = 0x5be0cd19;
    local_88.bytes = 0;
    secp256k1_sha256_write(&local_88,key,keylen);
    secp256k1_sha256_finalize(&local_88,(uchar *)local_c8);
    local_c8[0xc] = 0;
    local_c8[0xd] = 0;
    local_c8[0xe] = 0;
    local_c8[0xf] = 0;
    local_c8[8] = 0;
    local_c8[9] = 0;
    local_c8[10] = 0;
    local_c8[0xb] = 0;
  }
  (hash->outer).s[0] = 0x6a09e667;
  (hash->outer).s[1] = 0xbb67ae85;
  (hash->outer).s[2] = 0x3c6ef372;
  (hash->outer).s[3] = 0xa54ff53a;
  (hash->outer).s[4] = 0x510e527f;
  (hash->outer).s[5] = 0x9b05688c;
  (hash->outer).s[6] = 0x1f83d9ab;
  (hash->outer).s[7] = 0x5be0cd19;
  (hash->outer).bytes = 0;
  lVar1 = 0;
  do {
    *(uint *)((long)local_c8 + lVar1) = *(uint *)((long)local_c8 + lVar1) ^ 0x5c5c5c5c;
    *(uint *)((long)local_c8 + lVar1 + 4) = *(uint *)((long)local_c8 + lVar1 + 4) ^ 0x5c5c5c5c;
    *(uint *)((long)local_c8 + lVar1 + 8) = *(uint *)((long)local_c8 + lVar1 + 8) ^ 0x5c5c5c5c;
    *(uint *)((long)local_c8 + lVar1 + 0xc) = *(uint *)((long)local_c8 + lVar1 + 0xc) ^ 0x5c5c5c5c;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  secp256k1_sha256_write(&hash->outer,(uchar *)local_c8,0x40);
  (hash->inner).s[0] = 0x6a09e667;
  (hash->inner).s[1] = 0xbb67ae85;
  (hash->inner).s[2] = 0x3c6ef372;
  (hash->inner).s[3] = 0xa54ff53a;
  (hash->inner).s[4] = 0x510e527f;
  (hash->inner).s[5] = 0x9b05688c;
  (hash->inner).s[6] = 0x1f83d9ab;
  (hash->inner).s[7] = 0x5be0cd19;
  (hash->inner).bytes = 0;
  lVar1 = 0;
  do {
    *(uint *)((long)local_c8 + lVar1) = *(uint *)((long)local_c8 + lVar1) ^ 0x6a6a6a6a;
    *(uint *)((long)local_c8 + lVar1 + 4) = *(uint *)((long)local_c8 + lVar1 + 4) ^ 0x6a6a6a6a;
    *(uint *)((long)local_c8 + lVar1 + 8) = *(uint *)((long)local_c8 + lVar1 + 8) ^ 0x6a6a6a6a;
    *(uint *)((long)local_c8 + lVar1 + 0xc) = *(uint *)((long)local_c8 + lVar1 + 0xc) ^ 0x6a6a6a6a;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  secp256k1_sha256_write(&hash->inner,(uchar *)local_c8,0x40);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash, const unsigned char *key, size_t keylen) {
    size_t n;
    unsigned char rkey[64];
    if (keylen <= sizeof(rkey)) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, sizeof(rkey) - keylen);
    } else {
        secp256k1_sha256 sha256;
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, key, keylen);
        secp256k1_sha256_finalize(&sha256, rkey);
        memset(rkey + 32, 0, 32);
    }

    secp256k1_sha256_initialize(&hash->outer);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c;
    }
    secp256k1_sha256_write(&hash->outer, rkey, sizeof(rkey));

    secp256k1_sha256_initialize(&hash->inner);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c ^ 0x36;
    }
    secp256k1_sha256_write(&hash->inner, rkey, sizeof(rkey));
    memset(rkey, 0, sizeof(rkey));
}